

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

int __thiscall mpt::parser::open(parser *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  char *pcVar2;
  undefined8 unaff_RBX;
  FILE *__stream;
  
  __stream = (FILE *)(this->_d).src.arg;
  if (__file != (char *)0x0 || __stream != (FILE *)0x0) {
    if (__file == (char *)0x0) {
      pFVar1 = (FILE *)0x0;
    }
    else {
      pFVar1 = fopen(__file,"r");
      if (pFVar1 == (FILE *)0x0) {
        return 0;
      }
      __stream = (FILE *)(this->_d).src.arg;
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    (this->_d).src.getc = mpt_getchar_stdio;
    (this->_d).src.arg = pFVar1;
    (this->_d).src.line = 0;
    if (this->_fn != (char *)0x0) {
      free(this->_fn);
    }
    if (__file == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = strdup(__file);
    }
    this->_fn = pcVar2;
  }
  return (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
}

Assistant:

bool parser::open(const char *fn)
{
	if (!_d.src.arg) {
		if (!fn) {
			return true;
		}
	}
	FILE *old, *f = 0;
	if (fn && !(f = fopen(fn, "r"))) {
		return false;
	}
	old = static_cast<FILE *>(_d.src.arg);
	if (old) fclose(old);
	_d.src.getc = (int (*)(void *)) mpt_getchar_stdio;
	_d.src.arg  = f;
	_d.src.line = 0;
	if (_fn) free(_fn);
	_fn = fn ? strdup(fn) : 0;
	return true;
}